

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spritesheet.cpp
# Opt level: O2

void __thiscall Rml::SpritesheetList::Merge(SpritesheetList *this,SpritesheetList *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  type pSVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite>
  *pair;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  const_iterator __begin1;
  const_iterator local_30;
  
  ::std::
  vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::shared_ptr<Rml::Spritesheet_const>const*,std::vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>>,void>
            ((vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>
              *)this,(this->spritesheets).
                     super__Vector_base<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
             (other->spritesheets).
             super__Vector_base<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (other->spritesheets).
             super__Vector_base<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->sprite_map,(other->sprite_map).mNumElements + (this->sprite_map).mNumElements);
  local_30 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::cbegin(&other->sprite_map);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (other->sprite_map).mInfo;
  key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30.mKeyVals;
  while (key != pbVar1) {
    pSVar4 = robin_hood::detail::
             Table<true,80ul,std::__cxx11::string,Rml::Sprite,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
             ::doCreateByKey<std::__cxx11::string_const&,Rml::Sprite>
                       ((Table<true,80ul,std::__cxx11::string,Rml::Sprite,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                         *)&this->sprite_map,key);
    uVar2 = *(undefined4 *)&key[1]._M_string_length;
    uVar3 = *(undefined4 *)((long)&key[1]._M_string_length + 4);
    (pSVar4->rectangle).p0 = (Vector2Type)key[1]._M_dataplus._M_p;
    (pSVar4->rectangle).p1.x = (float)uVar2;
    (pSVar4->rectangle).p1.y = (float)uVar3;
    pSVar4->sprite_sheet = (Spritesheet *)key[1].field_2._M_allocated_capacity;
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Iter<true>::operator++(&local_30);
    key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30.mKeyVals;
  }
  return;
}

Assistant:

void SpritesheetList::Merge(const SpritesheetList& other)
{
	spritesheets.insert(spritesheets.end(), other.spritesheets.begin(), other.spritesheets.end());
	sprite_map.reserve(sprite_map.size() + other.sprite_map.size());

	for (auto& pair : other.sprite_map)
	{
		const String& sprite_name = pair.first;
		const Sprite& sprite = pair.second;

		// Add the sprite into our map. If a sprite with the same name exists, it will be overwritten by the other sprite.
		sprite_map[sprite_name] = sprite;
	}
}